

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O0

void * invoke_writer_ops(void *args)

{
  ts_nsec tVar1;
  size_t sVar2;
  ts_nsec end_00;
  SnapHandlePool *this;
  uint64_t *in_RDI;
  rep_conflict rVar3;
  duration<double,_std::ratio<1L,_1L>_> elapsed_seconds;
  ts_nsec endCommit;
  ts_nsec beginCommit;
  ts_nsec endSet;
  ts_nsec beginSet;
  char bodybuf [256];
  char keybuf [256];
  int index;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  end;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  start;
  fdb_status status;
  int j;
  int i;
  ops_args *oa;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffd40;
  fdb_file_handle *in_stack_fffffffffffffd48;
  FileHandlePool *in_stack_fffffffffffffd50;
  fdb_file_handle *in_stack_fffffffffffffd58;
  FileHandlePool *in_stack_fffffffffffffd60;
  char *keylen;
  type in_stack_fffffffffffffd70;
  duration<double,_std::ratio<1L,_1L>_> in_stack_fffffffffffffd78;
  fdb_kvs_handle *in_stack_fffffffffffffd80;
  int index_00;
  char local_258 [256];
  fdb_file_handle local_158 [6];
  int local_4c;
  FileHandlePool *local_48;
  undefined8 local_40;
  undefined8 local_38;
  fdb_kvs_handle *local_30;
  undefined8 local_28;
  fdb_status local_1c;
  int local_18;
  uint local_14;
  uint64_t *local_10;
  
  local_14 = 0;
  local_10 = in_RDI;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_fffffffffffffd40);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_fffffffffffffd40);
  local_38 = std::chrono::_V2::system_clock::now();
  local_28 = local_38;
  do {
    local_40 = 0;
    local_48 = (FileHandlePool *)0x0;
    local_4c = FileHandlePool::getAvailableResource
                         (in_stack_fffffffffffffd60,(fdb_file_handle **)in_stack_fffffffffffffd58,
                          (fdb_kvs_handle **)in_stack_fffffffffffffd50);
    local_1c = fdb_begin_transaction
                         (in_stack_fffffffffffffd48,
                          (fdb_isolation_level_t)((ulong)in_stack_fffffffffffffd40 >> 0x38));
    if (local_1c != FDB_RESULT_SUCCESS) {
      fdb_assert_die((char *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,
                     (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                     (uint64_t)in_stack_fffffffffffffd48,(uint64_t)in_stack_fffffffffffffd40);
    }
    local_18 = 10;
    while (local_18 = local_18 + -1, local_18 != 0) {
      sprintf((char *)local_158,"key%d",(ulong)local_14);
      sprintf(local_258,"body%d",(ulong)local_14);
      tVar1 = get_monotonic_ts();
      in_stack_fffffffffffffd58 = local_158;
      in_stack_fffffffffffffd50 = local_48;
      sVar2 = strlen((char *)local_158);
      in_stack_fffffffffffffd60 = (FileHandlePool *)(sVar2 + 1);
      keylen = local_258;
      strlen(local_258);
      local_1c = fdb_set_kv((fdb_kvs_handle *)in_stack_fffffffffffffd78.__r,
                            (void *)in_stack_fffffffffffffd70.__r,(size_t)keylen,
                            in_stack_fffffffffffffd60,(size_t)in_stack_fffffffffffffd58);
      end_00 = get_monotonic_ts();
      if (local_1c != FDB_RESULT_SUCCESS) {
        fdb_assert_die((char *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,
                       (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                       (uint64_t)in_stack_fffffffffffffd48,(uint64_t)in_stack_fffffffffffffd40);
      }
      in_stack_fffffffffffffd48 = (fdb_file_handle *)*local_10;
      ts_diff(tVar1,end_00);
      FileHandlePool::collectStat
                (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                 (uint64_t)in_stack_fffffffffffffd40);
      local_14 = local_14 + 1;
    }
    this = (SnapHandlePool *)get_monotonic_ts();
    local_1c = fdb_end_transaction(in_stack_fffffffffffffd58,
                                   (fdb_commit_opt_t)((ulong)in_stack_fffffffffffffd50 >> 0x38));
    tVar1 = get_monotonic_ts();
    if (local_1c != FDB_RESULT_SUCCESS) {
      fdb_assert_die((char *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,
                     (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                     (uint64_t)in_stack_fffffffffffffd48,(uint64_t)in_stack_fffffffffffffd40);
    }
    in_stack_fffffffffffffd40 =
         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *)*local_10;
    ts_diff((ts_nsec)this,tVar1);
    index_00 = (int)((ulong)tVar1 >> 0x20);
    FileHandlePool::collectStat
              (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
               (uint64_t)in_stack_fffffffffffffd40);
    if ((*(byte *)((long)local_10 + 0xc) & 1) != 0) {
      SnapHandlePool::addNewSnapHandle(this,index_00,in_stack_fffffffffffffd80);
    }
    FileHandlePool::returnResourceToPool
              (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    in_stack_fffffffffffffd80 = (fdb_kvs_handle *)std::chrono::_V2::system_clock::now();
    local_30 = in_stack_fffffffffffffd80;
    in_stack_fffffffffffffd70 =
         std::chrono::operator-
                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffd50,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffd48);
    rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                      ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xfffffffffffffd78);
  } while (rVar3 <= (double)*(float *)(local_10 + 1));
  pthread_exit((void *)0x0);
}

Assistant:

static void *invoke_writer_ops(void *args) {
    struct ops_args *oa = static_cast<ops_args *>(args);
    int i = 0, j;
    fdb_status status;
    std::chrono::time_point<std::chrono::system_clock> start, end;
    start = std::chrono::system_clock::now();

    while (true) {
        // Acquire handles from pool
        fdb_file_handle *dbfile = nullptr;
        fdb_kvs_handle *db = nullptr;
        const int index = oa->hp->getAvailableResource(&dbfile, &db);

        char keybuf[256], bodybuf[256];

        // Start transaction
        status = fdb_begin_transaction(dbfile, FDB_ISOLATION_READ_COMMITTED);
        fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

        // Issue a batch of 10 sets
        j = 10;
        while (--j != 0) {
            sprintf(keybuf, "key%d", i);
            sprintf(bodybuf, "body%d", i);

            ts_nsec beginSet = get_monotonic_ts();
            status = fdb_set_kv(db,
                                (void*)keybuf, strlen(keybuf) + 1,
                                (void*)bodybuf, strlen(bodybuf) + 1);
            ts_nsec endSet = get_monotonic_ts();
            fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);
            oa->hp->collectStat(SET, ts_diff(beginSet, endSet));
            ++i;
        }

        // End transaction (Commit)
        ts_nsec beginCommit = get_monotonic_ts();
        status = fdb_end_transaction(dbfile, FDB_COMMIT_NORMAL);
        ts_nsec endCommit = get_monotonic_ts();
        fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

        oa->hp->collectStat(COMMIT, ts_diff(beginCommit, endCommit));

        // Create a snapshot handle if snap handle pool is in use
        if (oa->snapPoolAvailable) {
            (static_cast<SnapHandlePool*>(oa->hp))->addNewSnapHandle(index, db);
        }

        // Return resource to pool
        oa->hp->returnResourceToPool(index);

        end = std::chrono::system_clock::now();
        std::chrono::duration<double> elapsed_seconds = end - start;
        if (elapsed_seconds.count() > oa->time) {
#ifdef __DEBUG_USECASE
            fprintf(stderr, "Writer: Ends after %fs\n", elapsed_seconds.count());
#endif
            break;
        }
    }
    thread_exit(0);
    return nullptr;
}